

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

char * __thiscall TiXmlElement::Attribute(TiXmlElement *this,char *name,int *i)

{
  TiXmlAttribute *this_00;
  char *pcVar1;
  
  this_00 = TiXmlAttributeSet::Find(&this->attributeSet,name);
  if (this_00 == (TiXmlAttribute *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = ((this_00->value).rep_)->str;
    if (i != (int *)0x0) {
      TiXmlAttribute::QueryIntValue(this_00,i);
    }
  }
  return pcVar1;
}

Assistant:

const char* TiXmlElement::Attribute( const char* name, int* i ) const
{
	const TiXmlAttribute* attrib = attributeSet.Find( name );
	const char* result = 0;

	if ( attrib ) {
		result = attrib->Value();
		if ( i ) {
			attrib->QueryIntValue( i );
		}
	}
	return result;
}